

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O2

void __thiscall TxConfirmStats::Write(TxConfirmStats *this,AutoFile *fileout)

{
  long in_FS_OFFSET;
  Wrapper<VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter>,_const_std::vector<double,_std::allocator<double>_>_&>
  local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  anon_unknown.dwarf_5c8973::EncodedDoubleFormatter::Ser<AutoFile>
            ((EncodedDoubleFormatter *)fileout,fileout,this->decay);
  AutoFile::operator<<(fileout,&this->scale);
  local_28.m_object = &this->m_feerate_avg;
  AutoFile::operator<<(fileout,&local_28);
  local_28.m_object = &this->txCtAvg;
  AutoFile::operator<<(fileout,&local_28);
  local_28.m_object = (vector<double,_std::allocator<double>_> *)&this->confAvg;
  AutoFile::operator<<
            (fileout,(Wrapper<VectorFormatter<VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter>_>,_const_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_&>
                      *)&local_28);
  local_28.m_object = (vector<double,_std::allocator<double>_> *)&this->failAvg;
  AutoFile::operator<<
            (fileout,(Wrapper<VectorFormatter<VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter>_>,_const_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_&>
                      *)&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TxConfirmStats::Write(AutoFile& fileout) const
{
    fileout << Using<EncodedDoubleFormatter>(decay);
    fileout << scale;
    fileout << Using<VectorFormatter<EncodedDoubleFormatter>>(m_feerate_avg);
    fileout << Using<VectorFormatter<EncodedDoubleFormatter>>(txCtAvg);
    fileout << Using<VectorFormatter<VectorFormatter<EncodedDoubleFormatter>>>(confAvg);
    fileout << Using<VectorFormatter<VectorFormatter<EncodedDoubleFormatter>>>(failAvg);
}